

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

ON_XMLVariant * __thiscall
ON_PostEffect::GetParameter
          (ON_XMLVariant *__return_storage_ptr__,ON_PostEffect *this,wchar_t *param_name)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  ON_XMLParameters p;
  ON_XMLParameters OStack_28;
  
  ::ON_XMLVariant::ON_XMLVariant(__return_storage_ptr__);
  ::ON_XMLVariant::SetNull(__return_storage_ptr__);
  pOVar2 = CImpl::PepNode(this->_impl);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x25])(pOVar2,L"state");
    if ((ON_XMLNode *)CONCAT44(extraout_var,iVar1) != (ON_XMLNode *)0x0) {
      ON_XMLParameters::ON_XMLParameters(&OStack_28,(ON_XMLNode *)CONCAT44(extraout_var,iVar1));
      ON_XMLParameters::GetParam(&OStack_28,param_name,__return_storage_ptr__);
      ON_XMLParameters::~ON_XMLParameters(&OStack_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_XMLVariant ON_PostEffect::GetParameter(const wchar_t* param_name) const
{
  ON_XMLVariant value;
  value.SetNull();

  const ON_XMLNode* pep_node = _impl->PepNode();
  if (nullptr != pep_node)
  {
    const ON_XMLNode* pep_param_node = pep_node->GetNamedChild(ON_RDK_PEP_PARAMS);
    if (nullptr != pep_param_node)
    {
      ON_XMLParameters p(*pep_param_node);
      p.GetParam(param_name, value);
    }
  }

  return value;
}